

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  cmExportSet *pcVar1;
  cmMakefile *this_00;
  cmInstallExportGenerator *pcVar2;
  pointer pcVar3;
  long lVar4;
  cmGeneratorTarget *pcVar5;
  _Alloc_hider __s1;
  bool bVar6;
  int iVar7;
  TargetType TVar8;
  PolicyStatus PVar9;
  uint uVar10;
  undefined8 *puVar11;
  string *psVar12;
  char *pcVar13;
  ostream *poVar14;
  long *plVar15;
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  *p_Var16;
  ostream *poVar17;
  size_type *psVar18;
  uint uVar19;
  char *versionString;
  uint uVar20;
  undefined8 uVar21;
  ulong uVar22;
  cmExportInstallFileGenerator *pcVar23;
  pointer ppcVar24;
  pointer config;
  bool bVar25;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar26;
  string sep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  string installPrefix;
  cmTargetExport *te;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  cmExportInstallFileGenerator *local_260;
  ostream *local_258;
  uint local_24c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  uint local_220;
  uint local_21c;
  string local_218;
  undefined1 local_1f8 [32];
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  *local_1d8;
  cmGeneratorTarget *local_1d0;
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  *local_1c8;
  iterator iStack_1c0;
  cmTargetExport **local_1b8;
  undefined1 local_1a8 [32];
  _Base_ptr local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  local_1c8 = (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               *)0x0;
  iStack_1c0._M_current = (cmTargetExport **)0x0;
  local_1b8 = (cmTargetExport **)0x0;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  pcVar1 = this->IEGen->ExportSet;
  ppcVar24 = (pcVar1->TargetExports).
             super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  bVar25 = ppcVar24 ==
           (pcVar1->TargetExports).
           super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_260 = this;
  local_258 = os;
  if (!bVar25) {
    local_1d0 = (cmGeneratorTarget *)&(this->super_cmExportFileGenerator).Namespace;
    local_1d8 = (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                 *)&(this->super_cmExportFileGenerator).ExportedTargets;
    do {
      std::operator+(&local_248,&local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0)
      ;
      cmGeneratorTarget::GetExportName_abi_cxx11_((string *)local_1f8,(*ppcVar24)->Target);
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        uVar21 = local_248.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_248._M_string_length + local_1f8._8_8_) {
        uVar22 = 0xf;
        if ((cmTargetExport *)local_1f8._0_8_ != (cmTargetExport *)(local_1f8 + 0x10)) {
          uVar22 = local_1f8._16_8_;
        }
        if (uVar22 < local_248._M_string_length + local_1f8._8_8_) goto LAB_003aeaf0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)local_1f8,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
      }
      else {
LAB_003aeaf0:
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,local_1f8._0_8_);
      }
      psVar18 = puVar11 + 2;
      if ((size_type *)*puVar11 == psVar18) {
        local_1a8._16_8_ = *psVar18;
        local_1a8._24_8_ = puVar11[3];
        local_1a8._0_8_ = local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *psVar18;
        local_1a8._0_8_ = (size_type *)*puVar11;
      }
      local_1a8._8_8_ = puVar11[1];
      *puVar11 = psVar18;
      puVar11[1] = 0;
      *(char *)psVar18 = '\0';
      std::__cxx11::string::_M_append((char *)&local_218,local_1a8._0_8_);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((cmTargetExport *)local_1f8._0_8_ != (cmTargetExport *)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_280,0,(char *)local_280._M_string_length,0x504c1e);
      local_1f8._0_8_ = *ppcVar24;
      pVar26 = std::
               _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               ::_M_insert_unique<cmGeneratorTarget*const&>
                         (local_1d8,&((cmTargetExport *)local_1f8._0_8_)->Target);
      if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"install(EXPORT \"",0x10);
        pcVar1 = local_260->IEGen->ExportSet;
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(pcVar1->Name)._M_dataplus._M_p,
                             (pcVar1->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" ...) ",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"includes target \"",0x11);
        psVar12 = cmGeneratorTarget::GetName_abi_cxx11_
                            (*(cmGeneratorTarget **)(local_1f8._0_8_ + 0x20));
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14,(psVar12->_M_dataplus)._M_p,psVar12->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\" more than once in the export set.",0x23);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Error(local_248._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else if (iStack_1c0._M_current == local_1b8) {
        std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>::
        _M_realloc_insert<cmTargetExport*const&>
                  ((vector<cmTargetExport*,std::allocator<cmTargetExport*>> *)&local_1c8,iStack_1c0,
                   (cmTargetExport **)local_1f8);
      }
      else {
        *iStack_1c0._M_current = (cmTargetExport *)local_1f8._0_8_;
        iStack_1c0._M_current = iStack_1c0._M_current + 1;
      }
      if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,
                          CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                   local_218.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_003aef05;
      }
      ppcVar24 = ppcVar24 + 1;
      bVar25 = ppcVar24 ==
               (local_260->IEGen->ExportSet->TargetExports).
               super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (!bVar25);
  }
  pcVar23 = local_260;
  cmExportFileGenerator::GenerateExpectedTargetsCode
            (&local_260->super_cmExportFileGenerator,local_258,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,
                    CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                             local_218.field_2._M_local_buf[0]) + 1);
  }
  if (bVar25) {
    this_00 = pcVar23->IEGen->LocalGenerator->Makefile;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_INSTALL_PREFIX","");
    pcVar13 = cmMakefile::GetSafeDefinition(this_00,(string *)local_1a8);
    std::__cxx11::string::string((string *)&local_218,pcVar13,(allocator *)&local_280);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    pcVar2 = pcVar23->IEGen;
    bVar25 = cmsys::SystemTools::FileIsFullPath(&(pcVar2->super_cmInstallGenerator).Destination);
    if (bVar25) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_258,
                 "# The installation prefix configured by this project.\nset(_IMPORT_PREFIX \"",0x4a
                );
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_258,local_218._M_dataplus._M_p,local_218._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\")\n\n",4);
    }
    else {
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_280,local_218._M_dataplus._M_p,
                 local_218._M_dataplus._M_p + local_218._M_string_length);
      std::__cxx11::string::append((char *)&local_280);
      plVar15 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_280,
                                   (ulong)(pcVar2->super_cmInstallGenerator).Destination._M_dataplus
                                          ._M_p);
      local_1a8._0_8_ = local_1a8 + 0x10;
      psVar18 = (size_type *)(plVar15 + 2);
      if ((size_type *)*plVar15 == psVar18) {
        local_1a8._16_8_ = *psVar18;
        local_1a8._24_8_ = plVar15[3];
      }
      else {
        local_1a8._16_8_ = *psVar18;
        local_1a8._0_8_ = (size_type *)*plVar15;
      }
      local_1a8._8_8_ = plVar15[1];
      *plVar15 = (long)psVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,
                        CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                 local_280.field_2._M_local_buf[0]) + 1);
      }
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_280,local_1a8._0_8_,(char *)(local_1a8._0_8_ + local_1a8._8_8_));
      std::__cxx11::string::append((char *)&local_280);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_258,"# Compute the installation prefix relative to this file.\n",0x39);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_258,"get_filename_component(_IMPORT_PREFIX",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_258," \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n",0x24);
      __s1._M_p = local_280._M_dataplus._M_p;
      iVar7 = strncmp(local_280._M_dataplus._M_p,"/lib/",5);
      if ((((iVar7 == 0) || (iVar7 = strncmp(__s1._M_p,"/lib64/",7), iVar7 == 0)) ||
          (iVar7 = strncmp(__s1._M_p,"/usr/lib/",9), iVar7 == 0)) ||
         (iVar7 = strncmp(__s1._M_p,"/usr/lib64/",0xb), iVar7 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_258,
                   "# Use original install prefix when loaded through a\n# cross-prefix symbolic link such as /lib -> /usr/lib.\nget_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\nget_filename_component(_realOrig \""
                   ,0xcc);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_258,(char *)local_1a8._0_8_,local_1a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\" REALPATH)\nif(_realCurr STREQUAL _realOrig)\n  set(_IMPORT_PREFIX \""
                   ,0x43);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14,(char *)local_1a8._0_8_,local_1a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\")\nendif()\nunset(_realOrig)\nunset(_realCurr)\n",0x2d);
      }
      pcVar3 = (pcVar2->super_cmInstallGenerator).Destination._M_dataplus._M_p;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,pcVar3,
                 pcVar3 + (pcVar2->super_cmInstallGenerator).Destination._M_string_length);
      if (local_248._M_string_length != 0) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_258,"get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n"
                     ,0x40);
          cmsys::SystemTools::GetFilenamePath((string *)local_1f8,&local_248);
          std::__cxx11::string::operator=((string *)&local_248,(string *)local_1f8);
          if ((cmTargetExport *)local_1f8._0_8_ != (cmTargetExport *)(local_1f8 + 0x10)) {
            operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
          }
        } while (local_248._M_string_length != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_258,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      pcVar23 = local_260;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,
                        CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                 local_280.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    local_248._M_dataplus._M_p = (char *)0x0;
    local_248._M_string_length = 0;
    local_248.field_2._M_allocated_capacity = 0;
    if (local_1c8 ==
        (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
         *)iStack_1c0._M_current) {
      bVar25 = false;
      uVar20 = 0;
      uVar10 = 0;
      uVar19 = 0;
    }
    else {
      local_24c = 0;
      bVar25 = false;
      local_21c = 0;
      local_220 = 0;
      p_Var16 = local_1c8;
      do {
        lVar4 = *(long *)&((_Rep_type *)&p_Var16->field_0x0)->_M_impl;
        pcVar5 = *(cmGeneratorTarget **)(lVar4 + 0x20);
        uVar20 = local_24c & 1;
        local_24c = (uint)CONCAT71((int7)((ulong)lVar4 >> 8),1);
        local_1d8 = p_Var16;
        if (uVar20 == 0) {
          TVar8 = cmGeneratorTarget::GetType(pcVar5);
          local_24c = CONCAT31((int3)(TVar8 >> 8),TVar8 != INTERFACE_LIBRARY);
        }
        cmExportFileGenerator::GenerateImportTargetCode
                  (&local_260->super_cmExportFileGenerator,local_258,pcVar5);
        p_Var16 = local_1d8;
        pcVar23 = local_260;
        local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
        local_1a8._16_8_ = 0;
        local_1a8._24_8_ = local_1a8 + 8;
        local_180 = 0;
        local_1d0 = pcVar5;
        local_188 = (_Base_ptr)local_1a8._24_8_;
        cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                  (&local_260->super_cmExportFileGenerator,*(cmTargetExport **)local_1d8,
                   InstallInterface,(ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        cmExportFileGenerator::PopulateSourcesInterface
                  (&pcVar23->super_cmExportFileGenerator,*(cmTargetExport **)p_Var16,
                   InstallInterface,(ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_260->super_cmExportFileGenerator,&local_280,local_1d0,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_COMPILE_DEFINITIONS","");
        pcVar5 = local_1d0;
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_260->super_cmExportFileGenerator,&local_280,local_1d0,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_COMPILE_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_260->super_cmExportFileGenerator,&local_280,pcVar5,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_AUTOUIC_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_260->super_cmExportFileGenerator,&local_280,pcVar5,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_COMPILE_FEATURES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_260->super_cmExportFileGenerator,&local_280,pcVar5,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        PVar9 = cmPolicies::PolicyMap::Get(&pcVar5->PolicyMap,CMP0022);
        if (((PVar9 != WARN) &&
            (PVar9 = cmPolicies::PolicyMap::Get(&pcVar5->PolicyMap,CMP0022), PVar9 != OLD)) &&
           ((bVar6 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                               (&local_260->super_cmExportFileGenerator,pcVar5,InstallInterface,
                                (ImportPropertyMap *)local_1a8,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_248), bVar6 &&
            (local_220 = local_220 & 0xff,
            (local_260->super_cmExportFileGenerator).ExportOld == false)))) {
          local_220 = 1;
        }
        TVar8 = cmGeneratorTarget::GetType(pcVar5);
        local_21c = local_21c & 0xff;
        if (TVar8 == INTERFACE_LIBRARY) {
          local_21c = 1;
        }
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"INTERFACE_SOURCES","")
        ;
        pcVar13 = cmGeneratorTarget::GetProperty(pcVar5,&local_280);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        if (pcVar13 != (char *)0x0) {
          bVar25 = true;
        }
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_POSITION_INDEPENDENT_CODE","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_260->super_cmExportFileGenerator,&local_280,pcVar5,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                  (&local_260->super_cmExportFileGenerator,pcVar5,(ImportPropertyMap *)local_1a8);
        cmExportFileGenerator::GenerateInterfaceProperties
                  (&local_260->super_cmExportFileGenerator,pcVar5,local_258,
                   (ImportPropertyMap *)local_1a8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_1a8);
        p_Var16 = local_1d8 + 8;
        pcVar23 = local_260;
        uVar20 = local_24c;
        uVar10 = local_220;
        uVar19 = local_21c;
      } while (p_Var16 !=
               (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                *)iStack_1c0._M_current);
    }
    poVar14 = local_258;
    if (((bVar25) || ((uVar19 & 1) != 0)) || ((uVar10 & 1) != 0)) {
      pcVar13 = "2.8.12";
      if ((uVar19 & 1) != 0) {
        pcVar13 = "3.0.0";
      }
      versionString = "3.1.0";
      if (!bVar25) {
        versionString = pcVar13;
      }
      cmExportFileGenerator::GenerateRequiredCMakeVersion
                (&pcVar23->super_cmExportFileGenerator,local_258,versionString);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"# Load information for each installed configuration.\n",0x35);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n",0x3f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"file(GLOB CONFIG_FILES \"${_DIR}/",0x20);
    GetConfigImportFileGlob_abi_cxx11_((string *)local_1a8,pcVar23);
    poVar14 = local_258;
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_258,(char *)local_1a8._0_8_,local_1a8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\")\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"foreach(f ${CONFIG_FILES})\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"  include(${f})\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"endforeach()\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"# Cleanup temporary variables.\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"set(_IMPORT_PREFIX)\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
    cmExportFileGenerator::GenerateImportedFileCheckLoop
              (&pcVar23->super_cmExportFileGenerator,poVar14);
    poVar14 = local_258;
    bVar25 = true;
    if (((char)uVar20 != '\0') &&
       (config = (pcVar23->super_cmExportFileGenerator).Configurations.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       config != (pcVar23->super_cmExportFileGenerator).Configurations.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      bVar25 = true;
      do {
        bVar6 = GenerateImportFileConfig
                          (pcVar23,config,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_248);
        if (!bVar6) {
          bVar25 = false;
        }
        config = config + 1;
      } while (config != (pcVar23->super_cmExportFileGenerator).Configurations.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    cmExportFileGenerator::GenerateMissingTargetsCheckCode
              (&pcVar23->super_cmExportFileGenerator,poVar14,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_248);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                               local_218.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
LAB_003aef05:
    bVar25 = false;
  }
  if (local_1c8 !=
      (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
       *)0x0) {
    operator_delete(local_1c8,(long)local_1b8 - (long)local_1c8);
  }
  return bVar25;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
  std::string expectedTargets;
  std::string sep;
  for(std::vector<cmTargetExport*>::const_iterator
        tei = this->IEGen->GetExportSet()->GetTargetExports()->begin();
      tei != this->IEGen->GetExportSet()->GetTargetExports()->end(); ++tei)
    {
    expectedTargets +=
        sep + this->Namespace + (*tei)->Target->GetExportName();
    sep = " ";
    cmTargetExport * te = *tei;
    if(this->ExportedTargets.insert(te->Target).second)
      {
      allTargets.push_back(te);
      }
    else
      {
      std::ostringstream e;
      e << "install(EXPORT \""
        << this->IEGen->GetExportSet()->GetName()
        << "\" ...) " << "includes target \"" << te->Target->GetName()
        << "\" more than once in the export set.";
      cmSystemTools::Error(e.str().c_str());
      return false;
      }
    }

  this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Set an _IMPORT_PREFIX variable for import location properties
  // to reference if they are relative to the install prefix.
  std::string installPrefix = this->IEGen->GetLocalGenerator()
      ->GetMakefile()->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
  std::string const& expDest = this->IEGen->GetDestination();
  if(cmSystemTools::FileIsFullPath(expDest))
    {
    // The export file is being installed to an absolute path so the
    // package is not relocatable.  Use the configured install prefix.
    os <<
      "# The installation prefix configured by this project.\n"
      "set(_IMPORT_PREFIX \"" << installPrefix << "\")\n"
      "\n";
    }
  else
    {
    // Add code to compute the installation prefix relative to the
    // import file location.
    std::string absDest = installPrefix + "/" + expDest;
    std::string absDestS = absDest + "/";
    os << "# Compute the installation prefix relative to this file.\n"
       << "get_filename_component(_IMPORT_PREFIX"
       << " \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n";
    if(cmHasLiteralPrefix(absDestS.c_str(), "/lib/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/lib64/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib64/"))
      {
      // Handle "/usr move" symlinks created by some Linux distros.
      os <<
        "# Use original install prefix when loaded through a\n"
        "# cross-prefix symbolic link such as /lib -> /usr/lib.\n"
        "get_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\n"
        "get_filename_component(_realOrig \"" << absDest << "\" REALPATH)\n"
        "if(_realCurr STREQUAL _realOrig)\n"
        "  set(_IMPORT_PREFIX \"" << absDest << "\")\n"
        "endif()\n"
        "unset(_realOrig)\n"
        "unset(_realCurr)\n";
      }
    std::string dest = expDest;
    while(!dest.empty())
      {
      os <<
        "get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n";
      dest = cmSystemTools::GetFilenamePath(dest);
      }
    os << "\n";
    }

  std::vector<std::string> missingTargets;

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for(std::vector<cmTargetExport*>::const_iterator
        tei = allTargets.begin();
      tei != allTargets.end(); ++tei)
    {
    cmGeneratorTarget* gt = (*tei)->Target;

    requiresConfigFiles = requiresConfigFiles
                              || gt->GetType() != cmState::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(*tei,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateSourcesInterface(*tei,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                                  gt,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS",
                                  gt,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS",
                                  gt,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS",
                                  gt,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES",
                                  gt,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);

    const bool newCMP0022Behavior =
        gt->GetPolicyStatusCMP0022() != cmPolicies::WARN
        && gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior)
      {
      if (this->PopulateInterfaceLinkLibrariesProperty(gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets)
          && !this->ExportOld)
        {
        require2_8_12 = true;
        }
      }
    if (gt->GetType() == cmState::INTERFACE_LIBRARY)
      {
      require3_0_0 = true;
      }
    if(gt->GetProperty("INTERFACE_SOURCES"))
      {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
      }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE",
                                  gt, properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);
    }

  if (require3_1_0)
    {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
    }
  else if (require3_0_0)
    {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
    }
  else if (require2_8_12)
    {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
    }

  // Now load per-configuration properties for them.
  os << "# Load information for each installed configuration.\n"
     << "get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n"
     << "file(GLOB CONFIG_FILES \"${_DIR}/"
     << this->GetConfigImportFileGlob() << "\")\n"
     << "foreach(f ${CONFIG_FILES})\n"
     << "  include(${f})\n"
     << "endforeach()\n"
     << "\n";

  // Cleanup the import prefix variable.
  os << "# Cleanup temporary variables.\n"
     << "set(_IMPORT_PREFIX)\n"
     << "\n";
  this->GenerateImportedFileCheckLoop(os);

  bool result = true;
  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles)
    {
    for(std::vector<std::string>::const_iterator
          ci = this->Configurations.begin();
        ci != this->Configurations.end(); ++ci)
      {
      if(!this->GenerateImportFileConfig(*ci, missingTargets))
        {
        result = false;
        }
      }
    }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return result;
}